

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xxhash.h
# Opt level: O3

xxh_u8 * XXH3_consumeStripes(xxh_u64 *acc,size_t *nbStripesSoFarPtr,size_t nbStripesPerBlock,
                            xxh_u8 *input,size_t nbStripes,xxh_u8 *secret,size_t secretLimit,
                            XXH3_f_accumulate f_acc,XXH3_f_scrambleAcc f_scramble)

{
  long lVar1;
  xxh_u8 *pxVar2;
  size_t sVar3;
  xxh_u8 *pxVar4;
  long lVar5;
  size_t sVar6;
  undefined1 auVar7 [16];
  uint uVar9;
  undefined1 auVar8 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  
  sVar6 = *nbStripesSoFarPtr;
  pxVar2 = secret + sVar6 * 8;
  sVar3 = nbStripesPerBlock - sVar6;
  if (sVar3 <= nbStripes) {
    do {
      if (sVar3 != 0) {
        sVar6 = 0;
        pxVar4 = input;
        do {
          lVar5 = 0;
          do {
            auVar11 = *(undefined1 (*) [16])(pxVar4 + lVar5);
            auVar10 = *(undefined1 (*) [16])(pxVar2 + lVar5) ^ auVar11;
            auVar8._0_8_ = auVar11._8_8_;
            auVar8._8_4_ = auVar11._0_4_;
            auVar8._12_4_ = auVar11._4_4_;
            lVar1 = ((long *)((long)acc + lVar5))[1];
            *(long *)((long)acc + lVar5) =
                 auVar8._0_8_ + *(long *)((long)acc + lVar5) +
                 (ulong)auVar10._4_4_ * (ulong)auVar10._0_4_;
            ((long *)((long)acc + lVar5))[1] =
                 auVar8._8_8_ + lVar1 + (ulong)auVar10._12_4_ * (ulong)auVar10._8_4_;
            lVar5 = lVar5 + 0x10;
          } while (lVar5 != 0x40);
          sVar6 = sVar6 + 1;
          pxVar2 = pxVar2 + 8;
          pxVar4 = pxVar4 + 0x40;
        } while (sVar6 != sVar3);
      }
      lVar5 = 0;
      do {
        auVar11 = *(undefined1 (*) [16])((long)acc + lVar5);
        auVar10._0_8_ = auVar11._0_8_ >> 0x2f;
        auVar10._8_8_ = auVar11._8_8_ >> 0x2f;
        auVar10 = auVar10 ^ *(undefined1 (*) [16])(secret + lVar5 + secretLimit) ^ auVar11;
        uVar9 = auVar10._4_4_;
        auVar11._4_4_ = uVar9;
        auVar11._0_4_ = uVar9;
        auVar11._8_4_ = auVar10._12_4_;
        auVar11._12_4_ = auVar10._12_4_;
        *(long *)((long)acc + lVar5) =
             ((ulong)uVar9 * 0x9e3779b1 << 0x20) + (ulong)auVar10._0_4_ * 0x9e3779b1;
        ((long *)((long)acc + lVar5))[1] =
             ((auVar11._8_8_ & 0xffffffff) * 0x9e3779b1 << 0x20) +
             (auVar10._8_8_ & 0xffffffff) * 0x9e3779b1;
        lVar5 = lVar5 + 0x10;
      } while (lVar5 != 0x40);
      nbStripes = nbStripes - sVar3;
      input = input + sVar3 * 0x40;
      sVar3 = nbStripesPerBlock;
      pxVar2 = secret;
    } while (nbStripesPerBlock <= nbStripes);
    *nbStripesSoFarPtr = 0;
    sVar6 = 0;
  }
  if (nbStripes != 0) {
    sVar3 = 0;
    pxVar4 = input;
    do {
      lVar5 = 0;
      do {
        auVar11 = *(undefined1 (*) [16])(pxVar4 + lVar5);
        auVar8 = *(undefined1 (*) [16])(pxVar2 + lVar5) ^ auVar11;
        uVar9 = auVar8._4_4_;
        auVar12._4_4_ = uVar9;
        auVar12._0_4_ = uVar9;
        auVar12._8_4_ = auVar8._12_4_;
        auVar12._12_4_ = auVar8._12_4_;
        auVar7._0_8_ = auVar11._8_8_;
        auVar7._8_4_ = auVar11._0_4_;
        auVar7._12_4_ = auVar11._4_4_;
        lVar1 = ((long *)((long)acc + lVar5))[1];
        *(long *)((long)acc + lVar5) =
             auVar7._0_8_ + *(long *)((long)acc + lVar5) + (ulong)uVar9 * (ulong)auVar8._0_4_;
        ((long *)((long)acc + lVar5))[1] =
             auVar7._8_8_ + lVar1 + (auVar12._8_8_ & 0xffffffff) * (ulong)auVar8._8_4_;
        lVar5 = lVar5 + 0x10;
      } while (lVar5 != 0x40);
      sVar3 = sVar3 + 1;
      pxVar2 = pxVar2 + 8;
      pxVar4 = pxVar4 + 0x40;
    } while (sVar3 != nbStripes);
    input = input + nbStripes * 0x40;
    *nbStripesSoFarPtr = sVar6 + nbStripes;
  }
  return input;
}

Assistant:

XXH_FORCE_INLINE const xxh_u8 *
XXH3_consumeStripes(xxh_u64* XXH_RESTRICT acc,
                    size_t* XXH_RESTRICT nbStripesSoFarPtr, size_t nbStripesPerBlock,
                    const xxh_u8* XXH_RESTRICT input, size_t nbStripes,
                    const xxh_u8* XXH_RESTRICT secret, size_t secretLimit,
                    XXH3_f_accumulate f_acc,
                    XXH3_f_scrambleAcc f_scramble)
{
    const xxh_u8* initialSecret = secret + *nbStripesSoFarPtr * XXH_SECRET_CONSUME_RATE;
    /* Process full blocks */
    if (nbStripes >= (nbStripesPerBlock - *nbStripesSoFarPtr)) {
        /* Process the initial partial block... */
        size_t nbStripesThisIter = nbStripesPerBlock - *nbStripesSoFarPtr;

        do {
            /* Accumulate and scramble */
            f_acc(acc, input, initialSecret, nbStripesThisIter);
            f_scramble(acc, secret + secretLimit);
            input += nbStripesThisIter * XXH_STRIPE_LEN;
            nbStripes -= nbStripesThisIter;
            /* Then continue the loop with the full block size */
            nbStripesThisIter = nbStripesPerBlock;
            initialSecret = secret;
        } while (nbStripes >= nbStripesPerBlock);
        *nbStripesSoFarPtr = 0;
    }
    /* Process a partial block */
    if (nbStripes > 0) {
        f_acc(acc, input, initialSecret, nbStripes);
        input += nbStripes * XXH_STRIPE_LEN;
        *nbStripesSoFarPtr += nbStripes;
    }
    /* Return end pointer */
    return input;
}